

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O0

void alSourceiv(ALuint name,ALenum param,ALint *values)

{
  uint local_20;
  uint32 local_1c;
  uint32 i;
  uint32 numvals;
  ALint *values_local;
  ALenum param_local;
  ALuint name_local;
  
  local_1c = 1;
  APILOCK();
  IO_ENTRYINFO(ALEE_alSourceiv);
  IO_UINT32(name);
  IO_ENUM(param);
  IO_PTR(values);
  if (((param != 0x202) && (param != 0x1001)) && (param != 0x1002)) {
    if (param == 0x1005) {
      local_1c = 3;
    }
    else if (((((param != 0x1007) && (param != 0x1009)) &&
              ((param != 0x1020 && ((param != 0x1021 && (param != 0x1023)))))) && (param != 0x1024))
            && ((param != 0x1025 && (param != 0x1026)))) {
      local_1c = 0;
    }
  }
  IO_UINT32(local_1c);
  for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
    IO_INT32(values[local_20]);
  }
  (*REAL_alSourceiv)(name,param,values);
  check_source_state_from_name(name);
  check_al_error_events();
  check_al_async_states();
  APIUNLOCK();
  return;
}

Assistant:

void alSourceiv(ALuint name, ALenum param, const ALint *values)
{
    uint32 numvals = 1;
    uint32 i;
    IO_START(alSourceiv);
    IO_UINT32(name);
    IO_ENUM(param);
    IO_PTR(values);

    switch (param) {
        case AL_BUFFER: break;
        case AL_SOURCE_RELATIVE: break;
        case AL_LOOPING: break;
        case AL_REFERENCE_DISTANCE: break;
        case AL_ROLLOFF_FACTOR: break;
        case AL_MAX_DISTANCE: break;
        case AL_CONE_INNER_ANGLE: break;
        case AL_CONE_OUTER_ANGLE: break;
        case AL_DIRECTION: numvals = 3; break;
        case AL_SEC_OFFSET: break;
        case AL_SAMPLE_OFFSET: break;
        case AL_BYTE_OFFSET: break;
        default: numvals = 0; break;   /* uhoh. */
    }

    IO_UINT32(numvals);
    for (i = 0; i < numvals; i++) {
        IO_INT32(values[i]);
    }

    REAL_alSourceiv(name, param, values);
    check_source_state_from_name(name);
    IO_END();
}